

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinycthread.c
# Opt level: O0

int cnd_timedwait(cnd_t *cond,mtx_t *mtx,timespec *ts)

{
  int iVar1;
  int ret;
  timespec *ts_local;
  mtx_t *mtx_local;
  cnd_t *cond_local;
  
  iVar1 = pthread_cond_timedwait((pthread_cond_t *)cond,(pthread_mutex_t *)mtx,(timespec *)ts);
  if (iVar1 == 0x6e) {
    cond_local._4_4_ = 2;
  }
  else {
    cond_local._4_4_ = (uint)(iVar1 == 0);
  }
  return cond_local._4_4_;
}

Assistant:

int cnd_timedwait(cnd_t *cond, mtx_t *mtx, const struct timespec *ts)
{
#if defined(_TTHREAD_WIN32_)
  struct timespec now;
  if (clock_gettime(CLOCK_REALTIME, &now) == 0)
  {
    DWORD delta = (DWORD) ((ts->tv_sec - now.tv_sec) * 1000 +
                           (ts->tv_nsec - now.tv_nsec + 500000) / 1000000);
    return _cnd_timedwait_win32(cond, mtx, delta);
  }
  else
    return thrd_error;
#else
  int ret;
  ret = pthread_cond_timedwait(cond, mtx, ts);
  if (ret == ETIMEDOUT)
  {
    return thrd_timeout;
  }
  return ret == 0 ? thrd_success : thrd_error;
#endif
}